

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

size_t input_nums(int *array,size_t length)

{
  int iVar1;
  void *__ptr;
  char *pcVar2;
  ulong local_458;
  size_t guess_id;
  char local_448 [4];
  int guess;
  char input [1024];
  size_t local_40;
  size_t guesses_correct;
  size_t n_guesses;
  size_t n;
  _Bool *guesses_done;
  size_t length_local;
  int *array_local;
  
  __ptr = malloc(length);
  for (n_guesses = 0; n_guesses < length; n_guesses = n_guesses + 1) {
    *(undefined1 *)((long)__ptr + n_guesses) = 0;
  }
  guesses_correct = 0;
  local_40 = 0;
  do {
    if (length <= guesses_correct) {
      free(__ptr);
      return local_40;
    }
    guess_id._4_4_ = -1;
    iVar1 = rand();
    local_458 = (ulong)iVar1;
    while (local_458 = local_458 % length, (*(byte *)((long)__ptr + local_458) & 1) != 0) {
      local_458 = local_458 + 1;
    }
    *(undefined1 *)((long)__ptr + local_458) = 1;
    printf("Please input the \x1b[93m%zuth\x1b[0m number:\n",local_458 + 1);
    while( true ) {
      printf("\x1b[96m> \x1b[0m");
      pcVar2 = fgets(local_448,0x400,_stdin);
      if (pcVar2 == (char *)0x0) {
        free(__ptr);
        return local_40;
      }
      if (local_448[0] == '\n') break;
      iVar1 = __isoc99_sscanf(local_448,"%d",(long)&guess_id + 4);
      if (iVar1 != 0) goto LAB_00101647;
      printf("\x1b[91mInvalid number!\n\x1b[0m");
    }
    printf("\x1b[91mYou did not put a number!\n\x1b[0m");
LAB_00101647:
    if (guess_id._4_4_ == array[local_458]) {
      printf("\x1b[92mGood job!\n\x1b[0m");
      local_40 = local_40 + 1;
      guesses_correct = guesses_correct + 1;
    }
    else {
      printf("\x1b[91mWrong number!\n\x1b[0m");
      guesses_correct = guesses_correct + 1;
    }
  } while( true );
}

Assistant:

size_t input_nums(const int* array, const size_t length) {
  bool* guesses_done = (bool*)malloc(sizeof(bool) * length);
  for (size_t n = 0; n < length; n++) guesses_done[n] = false;
  size_t n_guesses = 0;
  size_t guesses_correct = 0;

  while (n_guesses++ < length) {
    char input[1024];
    int guess = -1;
    size_t guess_id = (size_t)rand() % length;

    // Step until we hit a false
    while (guesses_done[guess_id]) guess_id = (guess_id + 1) % length;
    guesses_done[guess_id] = true;

    printf("Please input the " ANSI_COLOR_YELLOW "%zuth" ANSI_COLOR_NONE " number:\n", guess_id + 1);

    while (true) {
      printf(ANSI_COLOR_CYAN "> " ANSI_COLOR_NONE);

      // EOF
      if (!fgets(input, 1024, stdin)) {
        free(guesses_done);
        return guesses_correct;
      }

      // Empty line: display a warning
      if (input[0] == '\n') {
        printf(ANSI_COLOR_RED "You did not put a number!\n" ANSI_COLOR_NONE);
        break;
      }

      if (!sscanf(input, "%d", &guess)) {
        printf(ANSI_COLOR_RED "Invalid number!\n" ANSI_COLOR_NONE);
        // loop again
      } else {
        break;
      }
    }

    if (guess == array[guess_id]) {
      printf(ANSI_COLOR_GREEN "Good job!\n" ANSI_COLOR_NONE);
      guesses_correct++;
    } else {
      printf(ANSI_COLOR_RED "Wrong number!\n" ANSI_COLOR_NONE);
    }
  }

  free(guesses_done);
  return guesses_correct;
}